

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifTune.c
# Opt level: O3

word Ifn_NtkMatchCollectPerm(Ifn_Ntk_t *p,sat_solver *pSat)

{
  ulong uVar1;
  uint uVar2;
  word wVar3;
  ulong uVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  long lVar8;
  uint uVar9;
  long lVar10;
  
  uVar2 = p->nParsVNum;
  if (4 < (int)uVar2) {
    __assert_fail("p->nParsVNum <= 4",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifTune.c"
                  ,0x50f,"word Ifn_NtkMatchCollectPerm(Ifn_Ntk_t *, sat_solver *)");
  }
  iVar7 = 0;
  if ((long)p->nInps < 1) {
    wVar3 = 0;
  }
  else {
    lVar8 = 0;
    wVar3 = 0;
    do {
      if ((int)uVar2 < 1) {
        lVar10 = 0;
      }
      else {
        uVar9 = p->nParsVIni + iVar7;
        uVar4 = 0;
        uVar5 = 0;
        do {
          if (((int)uVar9 < 0) || (uVar1 = uVar9 + uVar4, pSat->size <= (int)uVar1)) {
            __assert_fail("v >= 0 && v < s->size",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver.h"
                          ,0xda,"int sat_solver_var_value(sat_solver *, int)");
          }
          uVar6 = 1 << ((byte)uVar4 & 0x1f);
          if (pSat->model[uVar1 & 0xffffffff] != 1) {
            uVar6 = 0;
          }
          uVar5 = uVar5 | uVar6;
          uVar4 = uVar4 + 1;
        } while (uVar2 != uVar4);
        lVar10 = (long)(int)uVar5;
      }
      wVar3 = wVar3 | lVar10 << ((char)lVar8 * '\x04' & 0x3fU);
      lVar8 = lVar8 + 1;
      iVar7 = iVar7 + uVar2;
    } while (lVar8 != p->nInps);
  }
  return wVar3;
}

Assistant:

word Ifn_NtkMatchCollectPerm( Ifn_Ntk_t * p, sat_solver * pSat )
{
    word Perm = 0;
    int i, v, Mint;
    assert( p->nParsVNum <= 4 );
    for ( i = 0; i < p->nInps; i++ )
    {
        for ( Mint = v = 0; v < p->nParsVNum; v++ )
            if ( sat_solver_var_value(pSat, p->nParsVIni + i * p->nParsVNum + v) )
                Mint |= (1 << v);
        Abc_TtSetHex( &Perm, i, Mint );
    }
    return Perm;
}